

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferTests.cpp
# Opt level: O1

void __thiscall
vkt::sparse::anon_unknown_0::SparseBufferTestInstance::draw
          (SparseBufferTestInstance *this,VkPrimitiveTopology topology,
          VkDescriptorSetLayout descriptorSetLayout,SpecializationMap *specMap)

{
  Move<vk::Handle<(vk::HandleType)9>_> *pMVar1;
  Move<vk::Handle<(vk::HandleType)13>_> *pAttachments;
  VkImageSubresourceRange *pVVar2;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar3;
  Move<vk::Handle<(vk::HandleType)14>_> *pMVar4;
  Move<vk::Handle<(vk::HandleType)18>_> *pMVar5;
  Move<vk::Handle<(vk::HandleType)24>_> *pMVar6;
  Move<vk::VkCommandBuffer_s_*> *pMVar7;
  deUint32 queueFamilyIndex;
  VkFormat VVar8;
  DeviceDriver *pDVar9;
  VkDevice pVVar10;
  Allocator *pAVar11;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *this_00;
  deUint64 dVar12;
  undefined8 uVar13;
  VkImage obj;
  Allocation *pAVar14;
  VkImageView obj_00;
  VkShaderModule VVar15;
  VkRenderPass obj_01;
  VkFramebuffer obj_02;
  VkPipelineLayout obj_03;
  VkPipeline obj_04;
  VkCommandPool obj_05;
  VkCommandBuffer_s *pVVar16;
  DeviceInterface *pDVar17;
  VkQueue queue;
  undefined4 uVar18;
  VkImageSubresourceRange subresourceRange;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  VkResult result;
  Renderer *pRVar22;
  const_iterator cVar23;
  mapped_type *ppVVar24;
  undefined4 uVar25;
  undefined1 local_458 [16];
  undefined8 local_448;
  VkCommandPool VStack_440;
  undefined8 local_438;
  VkImageCreateInfo *pVStack_430;
  undefined8 local_428;
  VkPipelineShaderStageCreateInfo *local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined4 local_408;
  undefined8 local_404;
  undefined8 uStack_3fc;
  undefined4 local_3f4;
  Move<vk::Handle<(vk::HandleType)16>_> *local_3f0;
  VkImageCreateInfo imageParams;
  key_type local_308;
  key_type local_2e8;
  Move<vk::Handle<(vk::HandleType)18>_> local_2c8;
  Move<vk::Handle<(vk::HandleType)17>_> local_2a8;
  VkPipelineColorBlendAttachmentState *local_288;
  undefined8 local_280;
  undefined8 uStack_278;
  Move<vk::Handle<(vk::HandleType)14>_> *local_268;
  Allocator *local_260;
  VkPipelineShaderStageCreateInfo pShaderStages [2];
  UniquePtr<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  renderer;
  VkAttachmentReference colorAttachmentRef;
  VkAttachmentDescription colorAttachmentDescription;
  undefined4 uStack_174;
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  local_158;
  VkVertexInputBindingDescription vertexInputBindingDescription;
  VkVertexInputAttributeDescription vertexInputAttributeDescription;
  VkRect2D scissor;
  VkViewport viewport;
  VkPipelineColorBlendAttachmentState pipelineColorBlendAttachmentState;
  VkPipelineInputAssemblyStateCreateInfo pipelineInputAssemblyStateInfo;
  VkPipelineMultisampleStateCreateInfo pipelineMultisampleStateInfo;
  VkPipelineViewportStateCreateInfo pipelineViewportStateInfo;
  
  pRVar22 = (Renderer *)operator_new(0x198);
  pDVar9 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar10 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  pAVar11 = (this->super_SparseResourcesBaseInstance).m_allocator.
            super_UniqueBase<vk::Allocator,_de::DefaultDeleter<vk::Allocator>_>.m_data.ptr;
  queueFamilyIndex = (this->m_universalQueue).queueFamilyIndex;
  this_00 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
             *)((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context)->
               m_progCollection;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"vert","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  local_260 = pAVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"frag","");
  dVar12 = (this->m_colorBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
           m_internal;
  VVar8 = this->m_colorFormat;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::_Rb_tree(&local_158,&specMap->_M_t);
  (pRVar22->m_colorBuffer).m_internal = dVar12;
  *(undefined8 *)(pRVar22->m_renderSize).m_data = *(undefined8 *)(this->m_renderSize).m_data;
  pRVar22->m_colorFormat = VVar8;
  (pRVar22->m_colorSubresourceRange).aspectMask = 1;
  (pRVar22->m_colorSubresourceRange).baseMipLevel = 0;
  (pRVar22->m_colorSubresourceRange).levelCount = 1;
  (pRVar22->m_colorSubresourceRange).baseArrayLayer = 0;
  (pRVar22->m_colorSubresourceRange).layerCount = 1;
  (pRVar22->m_clearColor).m_data[0] = 1.0;
  (pRVar22->m_clearColor).m_data[1] = 0.0;
  (pRVar22->m_clearColor).m_data[2] = 0.0;
  (pRVar22->m_clearColor).m_data[3] = 1.0;
  pRVar22->m_topology = topology;
  (pRVar22->m_descriptorSetLayout).m_internal = descriptorSetLayout.m_internal;
  pMVar1 = &pRVar22->m_colorImage;
  pAttachments = &pRVar22->m_colorAttachment;
  pMVar3 = &pRVar22->m_vertexModule;
  pMVar4 = &pRVar22->m_fragmentModule;
  local_3f0 = &pRVar22->m_pipelineLayout;
  pMVar5 = &pRVar22->m_pipeline;
  pMVar6 = &pRVar22->m_cmdPool;
  pMVar7 = &pRVar22->m_cmdBuffer;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal = 0
  ;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (pRVar22->m_colorImageAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
  .m_data.ptr = (Allocation *)0x0;
  memset(pAttachments,0,0x120);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_2D;
  uVar13 = *(undefined8 *)(pRVar22->m_renderSize).m_data;
  imageParams.extent.width = (deUint32)uVar13;
  imageParams.extent.height = (deUint32)((ulong)uVar13 >> 0x20);
  imageParams.extent.depth = 1;
  imageParams.mipLevels = 1;
  imageParams.arrayLayers = 1;
  imageParams.samples = VK_SAMPLE_COUNT_1_BIT;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0x11;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.queueFamilyIndexCount = 0;
  imageParams.pQueueFamilyIndices = (deUint32 *)0x0;
  imageParams._80_8_ = (ulong)(uint)imageParams._84_4_ << 0x20;
  imageParams.format = VVar8;
  local_268 = pMVar3;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)pShaderStages,
                    &pDVar9->super_DeviceInterface,pVVar10,&imageParams,(VkAllocationCallbacks *)0x0
                   );
  local_448 = (VkDevice)pShaderStages[0]._16_8_;
  VStack_440.m_internal = pShaderStages[0].module.m_internal;
  local_458._0_8_ = pShaderStages[0]._0_8_;
  local_458._8_8_ = pShaderStages[0].pNext;
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pShaderStages[0]._4_4_ = 0;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = 0;
  pShaderStages[0].module.m_internal = 0;
  obj.m_internal = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&(pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter
               ,obj);
  }
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       local_448;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)VStack_440.m_internal;
  (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal = local_458._0_8_
  ;
  (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)local_458._8_8_;
  if (pShaderStages[0]._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)9>_> *)&pShaderStages[0].pNext,
               (VkImage)pShaderStages[0]._0_8_);
  }
  bindImage((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&imageParams,
            &pDVar9->super_DeviceInterface,pVVar10,local_260,
            (VkImage)(pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.
                     m_internal,(MemoryRequirement)0x0);
  uVar13 = imageParams._0_8_;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  pAVar14 = (pRVar22->m_colorImageAlloc).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  if (pAVar14 != (Allocation *)uVar13) {
    if (pAVar14 != (Allocation *)0x0) {
      (*pAVar14->_vptr_Allocation[1])();
      (pRVar22->m_colorImageAlloc).
      super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
           (Allocation *)0x0;
    }
    (pRVar22->m_colorImageAlloc).
    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr =
         (Allocation *)uVar13;
  }
  pVVar2 = &pRVar22->m_colorSubresourceRange;
  if (imageParams._0_8_ != 0) {
    (**(code **)(*(long *)imageParams._0_8_ + 8))();
    imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    imageParams._4_4_ = 0;
  }
  uVar18 = (pRVar22->m_colorSubresourceRange).baseArrayLayer;
  uVar19 = pVVar2->aspectMask;
  uVar20 = pVVar2->baseMipLevel;
  uVar21 = pVVar2->levelCount;
  subresourceRange.levelCount = uVar21;
  subresourceRange.baseMipLevel = uVar20;
  subresourceRange.aspectMask = uVar19;
  subresourceRange.baseArrayLayer = uVar18;
  subresourceRange.layerCount = (pRVar22->m_colorSubresourceRange).layerCount;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_458,&pDVar9->super_DeviceInterface,
                pVVar10,(VkImage)(pRVar22->m_colorImage).
                                 super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
                                 m_internal,VK_IMAGE_VIEW_TYPE_2D,pRVar22->m_colorFormat,
                subresourceRange);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  obj_00.m_internal =
       (pAttachments->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(pRVar22->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.
                deleter,obj_00);
  }
  (pRVar22->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_device = (VkDevice)imageParams._16_8_;
  (pRVar22->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pAttachments->super_RefBase<vk::Handle<(vk::HandleType)13>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_colorAttachment).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(local_458 + 8),
               (VkImageView)local_458._0_8_);
  }
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,&local_2e8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_458,&pDVar9->super_DeviceInterface,
             pVVar10,*(ProgramBinary **)(cVar23._M_node + 2),0);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  VVar15.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  if (VVar15.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(pRVar22->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar15);
  }
  (pRVar22->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar22->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_vertexModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_458 + 8),
               (VkShaderModule)local_458._0_8_);
  }
  cVar23 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(this_00,&local_308);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)local_458,&pDVar9->super_DeviceInterface,
             pVVar10,*(ProgramBinary **)(cVar23._M_node + 2),0);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  VVar15.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  if (VVar15.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              (&(pRVar22->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.
                deleter,VVar15);
  }
  (pRVar22->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.m_device
       = (VkDevice)imageParams._16_8_;
  (pRVar22->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_allocator = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_fragmentModule).super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)14>_> *)(local_458 + 8),
               (VkShaderModule)local_458._0_8_);
  }
  pShaderStages[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[0].pNext = (void *)0x0;
  pShaderStages[0].flags = 0;
  pShaderStages[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  pShaderStages[0].module.m_internal =
       (pMVar3->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[0].pName = "main";
  imageParams.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  ppVVar24 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,&imageParams.sType);
  pShaderStages[0].pSpecializationInfo = *ppVVar24;
  pShaderStages[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  pShaderStages[1].pNext = (void *)0x0;
  pShaderStages[1].flags = 0;
  pShaderStages[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  pShaderStages[1].module.m_internal =
       (pMVar4->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
  pShaderStages[1].pName = "main";
  local_458._0_4_ = VK_SHADER_STAGE_FRAGMENT_BIT;
  ppVVar24 = std::
             map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
             ::operator[]((map<vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
                           *)&local_158,(key_type *)local_458);
  pShaderStages[1].pSpecializationInfo = *ppVVar24;
  colorAttachmentDescription._0_8_ = (ulong)pRVar22->m_colorFormat << 0x20;
  colorAttachmentDescription.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  stack0xfffffffffffffe88 = (PFN_vkInternalAllocationNotification)CONCAT44(uStack_174,2);
  imageParams.extent._4_8_ = &colorAttachmentRef;
  colorAttachmentRef.attachment = 0;
  colorAttachmentRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.extent.width = 0;
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.queueFamilyIndexCount = 0;
  imageParams._68_4_ = 0;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  imageParams.usage = 0;
  imageParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.format = VK_FORMAT_R4G4_UNORM_PACK8;
  local_458._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x100000000;
  local_438._0_4_ = 1;
  local_428 = (ulong)local_428._4_4_ << 0x20;
  local_420 = (VkPipelineShaderStageCreateInfo *)0x0;
  VStack_440.m_internal = (deUint64)&colorAttachmentDescription;
  pVStack_430 = &imageParams;
  ::vk::createRenderPass
            (&local_2a8,&pDVar9->super_DeviceInterface,pVVar10,(VkRenderPassCreateInfo *)local_458,
             (VkAllocationCallbacks *)0x0);
  imageParams._16_8_ =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device;
  imageParams.format =
       (VkFormat)local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
  ;
  imageParams.extent.width =
       (deUint32)
       ((ulong)local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
       >> 0x20);
  imageParams._0_8_ =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal;
  imageParams.pNext =
       local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal = 0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
       m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&(pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.
                deleter,obj_01);
  }
  (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  if (local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter,
               (VkRenderPass)
               local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_458,&pDVar9->super_DeviceInterface,
                  pVVar10,(VkRenderPass)
                          (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.
                          m_data.object.m_internal,1,(VkImageView *)pAttachments,
                  (pRVar22->m_renderSize).m_data[0],(pRVar22->m_renderSize).m_data[1],1);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  obj_02.m_internal =
       (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  if (obj_02.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              (&(pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.
                deleter,obj_02);
  }
  (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(local_458 + 8),
               (VkFramebuffer)local_458._0_8_);
  }
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)local_458,
                     &pDVar9->super_DeviceInterface,pVVar10,
                     (VkDescriptorSetLayout)(pRVar22->m_descriptorSetLayout).m_internal);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  obj_03.m_internal =
       (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal;
  if (obj_03.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              (&(pRVar22->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.
                deleter,obj_03);
  }
  (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(local_458 + 8),
               (VkPipelineLayout)local_458._0_8_);
  }
  scissor.extent = *(VkExtent2D *)(pRVar22->m_renderSize).m_data;
  vertexInputBindingDescription.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexInputBindingDescription.binding = 0;
  vertexInputBindingDescription.stride = 0x10;
  colorAttachmentRef.attachment = 0x13;
  imageParams._40_8_ = &pipelineInputAssemblyStateInfo;
  pipelineInputAssemblyStateInfo.pNext = (void *)0x0;
  viewport.width = (float)(pRVar22->m_renderSize).m_data[0];
  pipelineInputAssemblyStateInfo.primitiveRestartEnable = 0;
  pipelineInputAssemblyStateInfo._28_4_ = 0;
  viewport.height = (float)(pRVar22->m_renderSize).m_data[1];
  pipelineInputAssemblyStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO
  ;
  pipelineInputAssemblyStateInfo._4_4_ = 0;
  pipelineInputAssemblyStateInfo._16_8_ = (ulong)pRVar22->m_topology << 0x20;
  pipelineViewportStateInfo.pViewports = &viewport;
  viewport.x = 0.0;
  viewport.y = 0.0;
  viewport.minDepth = 0.0;
  viewport.maxDepth = 1.0;
  pipelineViewportStateInfo.pScissors = &scissor;
  scissor.offset.x = 0;
  scissor.offset.y = 0;
  imageParams._56_8_ = &pipelineViewportStateInfo;
  pipelineViewportStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  pipelineViewportStateInfo.pNext = (void *)0x0;
  pipelineViewportStateInfo.flags = 0;
  pipelineViewportStateInfo.viewportCount = 1;
  pipelineViewportStateInfo.scissorCount = 1;
  colorAttachmentDescription.samples = 0;
  colorAttachmentDescription.loadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  stack0xfffffffffffffe88 = (PFN_vkInternalAllocationNotification)0x0;
  colorAttachmentDescription.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_LOAD;
  colorAttachmentDescription.stencilStoreOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttachmentDescription.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  colorAttachmentDescription.flags = 0x17;
  colorAttachmentDescription.format = VK_FORMAT_UNDEFINED;
  imageParams.pQueueFamilyIndices = &pipelineMultisampleStateInfo.sType;
  pipelineMultisampleStateInfo.pNext = (void *)0x0;
  pipelineMultisampleStateInfo.sampleShadingEnable = 0;
  pipelineMultisampleStateInfo.minSampleShading = 0.0;
  pipelineMultisampleStateInfo.pSampleMask = (VkSampleMask *)0x0;
  pipelineMultisampleStateInfo.alphaToCoverageEnable = 0;
  pipelineMultisampleStateInfo.alphaToOneEnable = 0;
  pipelineMultisampleStateInfo.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  pipelineMultisampleStateInfo._4_4_ = 0;
  pipelineMultisampleStateInfo.flags = 0;
  pipelineMultisampleStateInfo.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  local_458._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0x100000000;
  local_428._0_4_ = 0;
  local_428._4_4_ = 7;
  local_438._0_4_ = 0;
  local_438._4_4_ = 0;
  pVStack_430 = (VkImageCreateInfo *)0x0;
  local_420 = (VkPipelineShaderStageCreateInfo *)0x0;
  uStack_418 = 0;
  local_410 = 0;
  local_408 = 7;
  local_404 = 0;
  uStack_3fc = 0;
  local_3f4 = 0x3f800000;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.m_internal._0_4_ = 0x1a;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2a8.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x100000003;
  local_288 = &pipelineColorBlendAttachmentState;
  pipelineColorBlendAttachmentState.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.alphaBlendOp = VK_BLEND_OP_ADD;
  pipelineColorBlendAttachmentState.colorWriteMask = 0xf;
  pipelineColorBlendAttachmentState.blendEnable = 0;
  pipelineColorBlendAttachmentState.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  pipelineColorBlendAttachmentState.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  pipelineColorBlendAttachmentState.colorBlendOp = VK_BLEND_OP_ADD;
  imageParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0;
  imageParams.imageType = VK_IMAGE_TYPE_3D;
  imageParams._24_8_ = pShaderStages;
  imageParams.extent._4_8_ = &colorAttachmentRef;
  imageParams.samples = 0;
  imageParams.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_280 = 0;
  uStack_278 = 0;
  imageParams._80_8_ = (Move<vk::Handle<(vk::HandleType)16>_> *)local_458;
  imageParams._64_8_ = (VkAllocationCallbacks *)&colorAttachmentDescription;
  ::vk::createGraphicsPipeline
            (&local_2c8,&pDVar9->super_DeviceInterface,pVVar10,(VkPipelineCache)0x0,
             (VkGraphicsPipelineCreateInfo *)&imageParams,(VkAllocationCallbacks *)0x0);
  imageParams._16_8_ =
       local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device;
  imageParams.format =
       (VkFormat)local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
  ;
  imageParams.extent.width =
       (deUint32)
       ((ulong)local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
       >> 0x20);
  imageParams._0_8_ =
       local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal;
  imageParams.pNext =
       local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface;
  local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal = 0;
  local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  obj_04.m_internal =
       (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal;
  if (obj_04.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&(pRVar22->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               obj_04);
  }
  (pRVar22->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar22->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_pipeline).super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)imageParams.pNext;
  if (local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              (&local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter,
               (VkPipeline)
               local_2c8.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  }
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)local_458,&pDVar9->super_DeviceInterface,
                  pVVar10,queueFamilyIndex);
  imageParams._16_8_ = local_448;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = (deUint32)(VStack_440.m_internal >> 0x20);
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  obj_05.m_internal =
       (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal;
  if (obj_05.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&(pRVar22->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
               obj_05);
  }
  (pRVar22->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)imageParams._16_8_;
  (pRVar22->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)CONCAT44(imageParams.extent.width,imageParams.format);
  (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       imageParams._0_8_;
  (pRVar22->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageParams.pNext;
  if (local_458._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)24>_> *)(local_458 + 8),
               (VkCommandPool)local_458._0_8_);
  }
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)local_458,&pDVar9->super_DeviceInterface,pVVar10,
             (VkCommandPool)
             (pMVar6->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  imageParams.flags = (VkImageCreateFlags)local_448;
  imageParams.imageType = local_448._4_4_;
  imageParams.format = (VkFormat)VStack_440.m_internal;
  imageParams.extent.width = VStack_440.m_internal._4_4_;
  imageParams._0_8_ = local_458._0_8_;
  imageParams.pNext = (void *)local_458._8_8_;
  local_458._0_8_ = 0;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)0x0;
  VStack_440.m_internal = 0;
  pVVar16 = (pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object;
  if (pVVar16 != (VkCommandBuffer_s *)0x0) {
    pDVar17 = (pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
              m_deviceIface;
    colorAttachmentDescription._0_8_ = pVVar16;
    (*pDVar17->_vptr_DeviceInterface[0x48])
              (pDVar17,(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                       m_device,
               (pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
               m_internal);
  }
  *(VkImageCreateFlags *)
   &(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
       imageParams.flags;
  *(VkImageType *)
   ((long)&(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device + 4
   ) = imageParams.imageType;
  *(VkFormat *)
   &(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal =
       imageParams.format;
  *(deUint32 *)
   ((long)&(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
           m_internal + 4) = imageParams.extent.width;
  *(VkStructureType *)&(pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object =
       imageParams.sType;
  *(undefined4 *)
   ((long)&(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 4) =
       imageParams._4_4_;
  *(undefined4 *)
   &(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       imageParams.pNext._0_4_;
  *(undefined4 *)
   ((long)&(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
           m_deviceIface + 4) = imageParams.pNext._4_4_;
  if (local_458._0_8_ != 0) {
    imageParams._0_8_ = local_458._0_8_;
    (*(*(_func_int ***)local_458._8_8_)[0x48])(local_458._8_8_,local_448,VStack_440.m_internal);
  }
  renderer.
  super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  .m_data.ptr = pRVar22;
  std::
  _Rb_tree<vk::VkShaderStageFlagBits,_std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>,_std::_Select1st<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>,_std::less<vk::VkShaderStageFlagBits>,_std::allocator<std::pair<const_vk::VkShaderStageFlagBits,_const_vk::VkSpecializationInfo_*>_>_>
  ::~_Rb_tree(&local_158);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  pDVar9 = (this->super_SparseResourcesBaseInstance).m_deviceDriver.
           super_UniqueBase<vk::DeviceDriver,_de::DefaultDeleter<vk::DeviceDriver>_>.m_data.ptr;
  pVVar10 = (this->super_SparseResourcesBaseInstance).m_logicalDevice.
            super_RefBase<vk::VkDevice_s_*>.m_data.object;
  queue = (this->m_universalQueue).queueHandle;
  beginCommandBuffer(&pDVar9->super_DeviceInterface,
                     (pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  pShaderStages[0].sType = (VkStructureType)(pRVar22->m_clearColor).m_data[0];
  pShaderStages[0]._4_4_ = (pRVar22->m_clearColor).m_data[1];
  pShaderStages[0].pNext = *(void **)((pRVar22->m_clearColor).m_data + 2);
  pVStack_430 = *(VkImageCreateInfo **)(pRVar22->m_renderSize).m_data;
  local_458._0_4_ = 0x2b;
  local_458._8_8_ = (DeviceInterface *)0x0;
  local_448 = (VkDevice)
              (pRVar22->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.object.
              m_internal;
  VStack_440.m_internal =
       (pRVar22->m_framebuffer).super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.object.
       m_internal;
  local_438._0_4_ = 0;
  local_438._4_4_ = 0;
  local_428._0_4_ = 1;
  local_420 = pShaderStages;
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x74])
            (pDVar9,(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             local_458,0);
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x4c])
            (pDVar9,(pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,
             (pMVar5->super_RefBase<vk::Handle<(vk::HandleType)18>_>).m_data.object.m_internal);
  (*(this->super_Delegate)._vptr_Delegate[2])
            (&this->super_Delegate,
             (local_3f0->super_RefBase<vk::Handle<(vk::HandleType)16>_>).m_data.object.m_internal,
             (pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x76])
            (pDVar9,(pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  imageParams.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x100;
  imageParams.imageType = 0x800;
  imageParams.format = VK_FORMAT_R4G4B4A4_UNORM_PACK16;
  imageParams.extent.width = 6;
  imageParams.extent.height = 0xffffffff;
  imageParams.extent.depth = 0xffffffff;
  dVar12 = (pMVar1->super_RefBase<vk::Handle<(vk::HandleType)9>_>).m_data.object.m_internal;
  imageParams.mipLevels = (deUint32)dVar12;
  imageParams.arrayLayers = (deUint32)(dVar12 >> 0x20);
  imageParams.samples = pVVar2->aspectMask;
  imageParams.tiling = (pRVar22->m_colorSubresourceRange).baseMipLevel;
  imageParams.usage = (pRVar22->m_colorSubresourceRange).levelCount;
  imageParams.sharingMode = (pRVar22->m_colorSubresourceRange).baseArrayLayer;
  imageParams.queueFamilyIndexCount = (pRVar22->m_colorSubresourceRange).layerCount;
  uVar25 = SUB84((VkGraphicsPipelineCreateInfo *)&imageParams,0);
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar9,(pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0x400,0x1000,0,0,
             0,0,0,1,uVar25);
  imageParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  imageParams._4_4_ = 0;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 1;
  imageParams.imageType = VK_IMAGE_TYPE_1D;
  imageParams.format = VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 1;
  imageParams.extent.height = 0;
  imageParams.extent.depth = 0;
  imageParams.mipLevels = 0;
  uVar13 = *(undefined8 *)(pRVar22->m_renderSize).m_data;
  imageParams.arrayLayers = (deUint32)uVar13;
  imageParams.samples = (VkSampleCountFlagBits)((ulong)uVar13 >> 0x20);
  imageParams.tiling = VK_IMAGE_TILING_LINEAR;
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[99])
            (pDVar9,(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             (pRVar22->m_colorImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.
             m_internal,6,(pRVar22->m_colorBuffer).m_internal,1,uVar25);
  imageParams.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
  imageParams.pNext = (void *)0x0;
  imageParams.flags = 0x1000;
  imageParams.imageType = 0x2000;
  imageParams.format = ~VK_FORMAT_UNDEFINED;
  imageParams.extent.width = 0xffffffff;
  dVar12 = (pRVar22->m_colorBuffer).m_internal;
  imageParams.extent.height = (deUint32)dVar12;
  imageParams.extent.depth = (deUint32)(dVar12 >> 0x20);
  imageParams.mipLevels = 0;
  imageParams.arrayLayers = 0;
  imageParams.samples = 0xffffffff;
  imageParams.tiling = ~VK_IMAGE_TILING_OPTIMAL;
  (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
            (pDVar9,(pRVar22->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
             0x1000,0x4000,0,0,0,1,uVar25,0,0);
  result = (*(pDVar9->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                     (pDVar9,(pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object);
  ::vk::checkResult(result,"vk.endCommandBuffer(*m_cmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferTests.cpp"
                    ,0x29c);
  submitCommandsAndWait
            (&pDVar9->super_DeviceInterface,pVVar10,queue,
             (pMVar7->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object,0,(VkSemaphore *)0x0,
             (VkPipelineStageFlags *)0x0,0,(VkSemaphore *)0x0);
  de::details::
  UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
  ::~UniqueBase(&renderer.
                 super_UniqueBase<vkt::sparse::(anonymous_namespace)::Renderer,_de::DefaultDeleter<vkt::sparse::(anonymous_namespace)::Renderer>_>
               );
  return;
}

Assistant:

void draw (const VkPrimitiveTopology	topology,
			   const VkDescriptorSetLayout	descriptorSetLayout	= DE_NULL,
			   Renderer::SpecializationMap	specMap				= Renderer::SpecializationMap())
	{
		const UniquePtr<Renderer> renderer(new Renderer(
			getDeviceInterface(), getDevice(), getAllocator(), m_universalQueue.queueFamilyIndex, descriptorSetLayout,
			m_context.getBinaryCollection(), "vert", "frag", *m_colorBuffer, m_renderSize, m_colorFormat, Vec4(1.0f, 0.0f, 0.0f, 1.0f), topology, specMap));

		renderer->draw(getDeviceInterface(), getDevice(), m_universalQueue.queueHandle, *this);
	}